

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_6::OutSliceInfo::OutSliceInfo
          (OutSliceInfo *this,PixelType t,char *base,ptrdiff_t spstride,ptrdiff_t xst,ptrdiff_t yst,
          int xsm,int ysm,bool z)

{
  bool z_local;
  ptrdiff_t yst_local;
  ptrdiff_t xst_local;
  ptrdiff_t spstride_local;
  char *base_local;
  PixelType t_local;
  OutSliceInfo_conflict *this_local;
  
  this->type = t;
  this->base = base;
  this->xStride = spstride;
  this->yStride = xst;
  this->xSampling = (int)yst;
  this->ySampling = (int)((ulong)yst >> 0x20);
  *(int *)&this->zero = xsm;
  *(int *)&this->field_0x2c = ysm;
  *(bool *)&this[1].type = z;
  return;
}

Assistant:

OutSliceInfo::OutSliceInfo (PixelType t,
                            const char * base,
                            ptrdiff_t spstride,
                            ptrdiff_t xst,
                            ptrdiff_t yst,
                            int xsm, int ysm,
                            bool z)
:
    type (t),
    base (base),
    sampleStride (spstride),
    xStride(xst),
    yStride(yst),
    xSampling (xsm),
    ySampling (ysm),
    zero (z)
{
    // empty
}